

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS
ref_collapse_edge_normdev(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE pRVar1;
  REF_GEOM pRVar2;
  REF_ADJ pRVar3;
  REF_ADJ_ITEM pRVar4;
  bool bVar5;
  uint uVar6;
  REF_CELL pRVar7;
  uint uVar8;
  REF_STATUS RVar9;
  long lVar10;
  REF_CELL pRVar11;
  long lVar12;
  REF_CELL pRVar13;
  undefined8 uVar14;
  char *pcVar15;
  REF_GRID pRVar16;
  REF_BOOL supported;
  REF_BOOL node0_support;
  REF_BOOL node1_support;
  REF_DBL new_uv_area;
  REF_DBL orig_uv_area;
  REF_DBL sign_uv_area;
  REF_DBL new_dev;
  REF_DBL orig_dev;
  REF_INT nodes [27];
  REF_INT new_nodes [27];
  int local_17c;
  REF_GRID local_178;
  REF_GEOM local_170;
  REF_CELL local_168;
  int local_15c;
  uint local_158;
  int local_154;
  REF_CELL local_150;
  REF_NODE local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  uint local_118 [28];
  uint local_a8 [30];
  
  pRVar1 = ref_grid->node;
  pRVar2 = ref_grid->geom;
  local_158 = node1;
  uVar8 = ref_geom_supported(pRVar2,node0,&local_15c);
  uVar6 = local_158;
  if (uVar8 == 0) {
    local_148 = pRVar1;
    uVar8 = ref_geom_supported(pRVar2,local_158,&local_154);
    if (uVar8 == 0) {
      if ((((pRVar2->model == (void *)0x0) && (pRVar2->meshlink == (void *)0x0)) || (local_15c == 0)
          ) || ((local_154 == 0 || (*allowed = 0, (int)uVar6 < 0)))) goto LAB_0015ed74;
      pRVar13 = ref_grid->cell[3];
      pRVar3 = pRVar13->ref_adj;
      pRVar16 = ref_grid;
      local_170 = pRVar2;
      if (((int)uVar6 < pRVar3->nnode) &&
         (pRVar11 = (REF_CELL)(long)pRVar3->first[uVar6], pRVar11 != (REF_CELL)0xffffffffffffffff))
      {
        local_178 = ref_grid;
        uVar8 = ref_cell_nodes(pRVar13,pRVar3->item[(long)pRVar11].ref,(REF_INT *)local_118);
        if (uVar8 == 0) {
          local_168 = pRVar11;
          local_150 = pRVar13;
          do {
            uVar8 = ref_geom_tri_supported(local_170,(REF_INT *)local_118,&local_17c);
            if (uVar8 != 0) {
              pcVar15 = "tri support";
              uVar14 = 0x3ba;
              goto LAB_0015f11c;
            }
            if (local_17c != 0) {
              lVar10 = (long)local_150->node_per;
              if (0 < lVar10) {
                lVar12 = 0;
                bVar5 = false;
                do {
                  if (local_118[lVar12] == node0) {
                    bVar5 = true;
                  }
                  lVar12 = lVar12 + 1;
                } while (lVar10 != lVar12);
                if (bVar5) goto LAB_0015ed29;
                if (0 < local_150->node_per) {
                  lVar12 = 0;
                  do {
                    uVar8 = local_118[lVar12];
                    if (local_118[lVar12] == uVar6) {
                      uVar8 = node0;
                    }
                    local_a8[lVar12] = uVar8;
                    lVar12 = lVar12 + 1;
                    lVar10 = (long)local_150->node_per;
                  } while (lVar12 < lVar10);
                }
              }
              local_a8[lVar10] = local_118[lVar10];
              uVar8 = ref_geom_cell_tuv_supported(local_170,(REF_INT *)local_118,2,&local_17c);
              if (uVar8 != 0) {
                pcVar15 = "tuv support for original configuration";
                uVar14 = 0x3cc;
                goto LAB_0015f11c;
              }
              if (local_17c == 0) {
                uVar14 = 0x3ce;
                goto LAB_0015effa;
              }
              uVar8 = ref_geom_tri_norm_deviation(local_178,(REF_INT *)local_118,&local_120);
              if (uVar8 != 0) {
                pcVar15 = "orig";
                uVar14 = 0x3cf;
                goto LAB_0015f11c;
              }
              uVar8 = ref_geom_cell_tuv_supported(local_170,(REF_INT *)local_a8,2,&local_17c);
              pRVar16 = local_178;
              if (uVar8 != 0) {
                pcVar15 = "tuv support for swapped configuration";
                uVar14 = 0x3d2;
                goto LAB_0015f11c;
              }
              if (((local_17c == 0) ||
                  (RVar9 = ref_geom_tri_norm_deviation(local_178,(REF_INT *)local_a8,&local_128),
                  RVar9 != 0)) ||
                 ((local_128 < pRVar16->adapt->post_min_normdev && (local_128 < local_120))))
              goto LAB_0015efa5;
            }
LAB_0015ed29:
            pRVar4 = local_150->ref_adj->item;
            pRVar13 = (REF_CELL)(long)pRVar4[(int)local_168].next;
            pRVar16 = local_178;
            if (pRVar13 == (REF_CELL)0xffffffffffffffff) goto LAB_0015ed63;
            local_168 = pRVar13;
            uVar8 = ref_cell_nodes(local_150,pRVar4[(long)pRVar13].ref,(REF_INT *)local_118);
          } while (uVar8 == 0);
        }
        uVar14 = 0x3b8;
      }
      else {
LAB_0015ed63:
        if ((pRVar16->geom->meshlink != (void *)0x0) || ((int)uVar6 < 0)) {
LAB_0015ed74:
          *allowed = 1;
          return 0;
        }
        pRVar13 = pRVar16->cell[3];
        pRVar3 = pRVar13->ref_adj;
        if ((pRVar3->nnode <= (int)uVar6) ||
           (local_178 = (REF_GRID)(long)pRVar3->first[uVar6],
           local_178 == (REF_GRID)0xffffffffffffffff)) goto LAB_0015ed74;
        uVar8 = ref_cell_nodes(pRVar13,pRVar3->item[(long)local_178].ref,(REF_INT *)local_118);
        pRVar7 = pRVar13;
        pRVar11 = local_168;
        while (local_168 = pRVar7, uVar8 == 0) {
          lVar10 = (long)pRVar13->node_per;
          if (lVar10 < 1) {
LAB_0015ee66:
            local_a8[lVar10] = local_118[lVar10];
            uVar8 = ref_geom_cell_tuv_supported(local_170,(REF_INT *)local_118,2,&local_17c);
            if (uVar8 != 0) {
              pcVar15 = "tuv support for original configuration";
              uVar14 = 0x3fe;
LAB_0015f11c:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,uVar14,"ref_collapse_edge_normdev",(ulong)uVar8,pcVar15);
              return uVar8;
            }
            if (local_17c == 0) {
              uVar14 = 0x400;
LAB_0015effa:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,uVar14,"ref_collapse_edge_normdev",
                     "original configuration before collapse does not support cell tuv");
              return 1;
            }
            uVar8 = ref_geom_cell_tuv_supported(local_170,(REF_INT *)local_a8,2,&local_17c);
            if (uVar8 != 0) {
              pcVar15 = "tuv support for swapped configuration";
              uVar14 = 0x403;
              goto LAB_0015f11c;
            }
            if (local_17c == 0) {
LAB_0015efa5:
              *allowed = 0;
              return 0;
            }
            uVar8 = ref_geom_uv_area_sign(pRVar16,local_118[local_168->node_per],&local_130);
            pRVar2 = local_170;
            if (uVar8 != 0) {
              pcVar15 = "sign";
              uVar14 = 0x40a;
LAB_0015f152:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,uVar14,"ref_collapse_edge_normdev",(ulong)uVar8,pcVar15);
              return uVar8;
            }
            uVar8 = ref_geom_uv_area(local_170,(REF_INT *)local_118,&local_138);
            if (uVar8 != 0) {
              pcVar15 = "uv area";
              uVar14 = 0x40b;
              goto LAB_0015f11c;
            }
            uVar8 = ref_geom_uv_area(pRVar2,(REF_INT *)local_a8,&local_140);
            if (uVar8 != 0) {
              pcVar15 = "uv area";
              uVar14 = 0x40c;
              goto LAB_0015f152;
            }
            pRVar13 = local_168;
            pRVar16 = ref_grid;
            if ((local_140 * local_130 <= local_148->min_uv_area) &&
               (local_140 * local_130 < local_130 * local_138)) goto LAB_0015efa5;
          }
          else {
            lVar12 = 0;
            bVar5 = false;
            do {
              if (local_118[lVar12] == node0) {
                bVar5 = true;
              }
              lVar12 = lVar12 + 1;
            } while (lVar10 != lVar12);
            if (!bVar5) {
              if (0 < pRVar13->node_per) {
                lVar12 = 0;
                do {
                  uVar8 = local_118[lVar12];
                  if (local_118[lVar12] == uVar6) {
                    uVar8 = node0;
                  }
                  local_a8[lVar12] = uVar8;
                  lVar12 = lVar12 + 1;
                  lVar10 = (long)pRVar13->node_per;
                } while (lVar12 < lVar10);
              }
              goto LAB_0015ee66;
            }
          }
          pRVar4 = pRVar13->ref_adj->item;
          local_178 = (REF_GRID)(long)pRVar4[(int)local_178].next;
          if (local_178 == (REF_GRID)0xffffffffffffffff) goto LAB_0015ed74;
          uVar8 = ref_cell_nodes(pRVar13,pRVar4[(long)local_178].ref,(REF_INT *)local_118);
          pRVar7 = local_168;
          pRVar11 = local_168;
        }
        uVar14 = 0x3ec;
        local_168 = pRVar11;
      }
      pcVar15 = "nodes";
    }
    else {
      pcVar15 = "support1";
      uVar14 = 0x3ad;
    }
  }
  else {
    pcVar15 = "support0";
    uVar14 = 0x3ac;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",uVar14
         ,"ref_collapse_edge_normdev",(ulong)uVar8,pcVar15);
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_normdev(REF_GRID ref_grid, REF_INT node0,
                                             REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell;
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed;

  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_BOOL node0_support, node1_support, supported;
  REF_DBL orig_dev, new_dev;
  REF_DBL sign_uv_area, orig_uv_area, new_uv_area;

  RSS(ref_geom_supported(ref_geom, node0, &node0_support), "support0");
  RSS(ref_geom_supported(ref_geom, node1, &node1_support), "support1");
  if (!(ref_geom_model_loaded(ref_geom) || ref_geom_meshlinked(ref_geom)) ||
      !node0_support || !node1_support) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (!supported) continue; /* no geom support, check by same normal */

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      new_nodes[node] = nodes[node];
      if (node1 == new_nodes[node]) new_nodes[node] = node0;
    }
    new_nodes[ref_cell_node_per(ref_cell)] = nodes[ref_cell_node_per(ref_cell)];

    RSS(ref_geom_cell_tuv_supported(ref_geom, nodes, REF_GEOM_FACE, &supported),
        "tuv support for original configuration");
    RAS(supported,
        "original configuration before collapse does not support cell tuv");
    RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &orig_dev), "orig");
    RSS(ref_geom_cell_tuv_supported(ref_geom, new_nodes, REF_GEOM_FACE,
                                    &supported),
        "tuv support for swapped configuration");
    if (!supported) { /* abort collapse, cell tuv not supported */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    if (REF_SUCCESS !=
        ref_geom_tri_norm_deviation(ref_grid, new_nodes, &new_dev)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    /* allow if improvement */
    if ((new_dev < ref_grid_adapt(ref_grid, post_min_normdev)) &&
        (new_dev < orig_dev)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  /* skip uv checks for meshlink */
  if (ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      new_nodes[node] = nodes[node];
      if (node1 == new_nodes[node]) new_nodes[node] = node0;
    }
    new_nodes[ref_cell_node_per(ref_cell)] = nodes[ref_cell_node_per(ref_cell)];

    /* see if new config is below limit */
    RSS(ref_geom_cell_tuv_supported(ref_geom, nodes, REF_GEOM_FACE, &supported),
        "tuv support for original configuration");
    RAS(supported,
        "original configuration before collapse does not support cell tuv");
    RSS(ref_geom_cell_tuv_supported(ref_geom, new_nodes, REF_GEOM_FACE,
                                    &supported),
        "tuv support for swapped configuration");
    if (!supported) { /* abort collapse, cell tuv not supported */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    RSS(ref_geom_uv_area_sign(ref_grid, nodes[ref_cell_node_per(ref_cell)],
                              &sign_uv_area),
        "sign");
    RSS(ref_geom_uv_area(ref_geom, nodes, &orig_uv_area), "uv area");
    RSS(ref_geom_uv_area(ref_geom, new_nodes, &new_uv_area), "uv area");
    /* allow if improvement */
    if ((sign_uv_area * new_uv_area <= ref_node_min_uv_area(ref_node)) &&
        (sign_uv_area * new_uv_area < sign_uv_area * orig_uv_area)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}